

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcNamedUnit::~IfcNamedUnit(IfcNamedUnit *this)

{
  ~IfcNamedUnit((IfcNamedUnit *)
                ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).
                        _vptr_ObjectHelper +
                (long)(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).
                      _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcNamedUnit() : Object("IfcNamedUnit") {}